

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O1

void __thiscall TUPU::TImage::~TImage(TImage *this)

{
  pointer pcVar1;
  
  this->_vptr_TImage = (_func_int **)&PTR__TImage_00502ce8;
  free(this->m_buffer);
  pcVar1 = (this->m_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_filename).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_sequenceId)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_sequenceId).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_tag)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_tag).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_path).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_url)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_url).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TImage::~TImage()
{
    std::free(m_buffer);
}